

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxConversion.h
# Opt level: O0

String * __thiscall
Jinx::Impl::UnsignedIntegerToString_abi_cxx11_
          (String *__return_storage_ptr__,Impl *this,uint64_t value)

{
  Allocator<char> local_39;
  char local_38 [8];
  char buffer [32];
  uint64_t value_local;
  
  buffer._24_8_ = this;
  snprintf(local_38,0x20,"%lu",this);
  Allocator<char>::Allocator(&local_39);
  std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
  basic_string<Jinx::Allocator<char>>
            ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)
             __return_storage_ptr__,local_38,&local_39);
  return __return_storage_ptr__;
}

Assistant:

inline String UnsignedIntegerToString(uint64_t value)
	{
		char buffer[32];
		snprintf(buffer, 32, "%" PRIu64, value);
		return String(buffer);
	}